

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderText(ImVec2 pos,char *text,char *text_end,bool hide_text_after_hash)

{
  float font_size;
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImFont *font;
  ImGuiContext *pIVar2;
  ImU32 col;
  size_t sVar3;
  char *local_40;
  char *text_display_end;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *pcStack_20;
  bool hide_text_after_hash_local;
  char *text_end_local;
  char *text_local;
  ImVec2 pos_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  text_local = (char *)pos;
  if (hide_text_after_hash) {
    local_40 = FindRenderedTextEnd(text,text_end);
  }
  else {
    pcStack_20 = text_end;
    if (text_end == (char *)0x0) {
      sVar3 = strlen(text);
      pcStack_20 = text + sVar3;
    }
    local_40 = pcStack_20;
  }
  if (text != local_40) {
    this = pIVar1->DrawList;
    font = pIVar2->Font;
    font_size = pIVar2->FontSize;
    col = GetColorU32(0,1.0);
    ImDrawList::AddText(this,font,font_size,(ImVec2 *)&text_local,col,text,local_40,0.0,
                        (ImVec4 *)0x0);
    if ((pIVar2->LogEnabled & 1U) != 0) {
      LogRenderedText((ImVec2 *)&text_local,text,local_40);
    }
  }
  return;
}

Assistant:

void ImGui::RenderText(ImVec2 pos, const char* text, const char* text_end, bool hide_text_after_hash)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Hide anything after a '##' string
    const char* text_display_end;
    if (hide_text_after_hash)
    {
        text_display_end = FindRenderedTextEnd(text, text_end);
    }
    else
    {
        if (!text_end)
            text_end = text + strlen(text); // FIXME-OPT
        text_display_end = text_end;
    }

    if (text != text_display_end)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end);
        if (g.LogEnabled)
            LogRenderedText(&pos, text, text_display_end);
    }
}